

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

int ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                 void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                 float scale_max,ImVec2 frame_size)

{
  ImGuiWindow *this;
  undefined1 auVar1 [12];
  bool bVar2;
  ImU32 IVar3;
  float fVar4;
  int iVar5;
  ImGuiContext *g;
  ImGuiContext *pIVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  uint in_XMM0_Db;
  ImVec2 IVar11;
  float fVar13;
  ImVec2 IVar12;
  uint in_XMM0_Dc;
  undefined4 uVar14;
  uint in_XMM0_Dd;
  undefined1 extraout_var [12];
  undefined4 uVar15;
  float fVar16;
  float fVar17;
  undefined8 in_XMM2_Qb;
  undefined8 uVar19;
  undefined1 auVar18 [16];
  float fVar20;
  ImVec2 pos1;
  ImVec2 pos0;
  ImRect frame_bb;
  ImRect total_bb;
  ImVec2 local_130;
  ImVec2 local_128;
  undefined8 uStack_120;
  ImGuiContext *local_110;
  void *local_108;
  ImU32 local_100;
  ImU32 local_fc;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  ImVec2 local_e0;
  ImRect local_d8;
  float local_c8;
  float local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  undefined1 local_a8 [16];
  ImVec2 local_98;
  float local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 local_78 [16];
  char *local_60;
  undefined1 local_58 [24];
  ImRect local_40;
  
  pIVar6 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  uVar7 = 0xffffffff;
  if (this->SkipItems == false) {
    uStack_f0 = in_XMM2_Qb;
    local_f8 = (undefined1  [8])frame_size;
    local_108 = data;
    local_c8 = scale_max;
    local_b8 = scale_min;
    uStack_b4 = in_XMM0_Db;
    uStack_b0 = in_XMM0_Dc;
    uStack_ac = in_XMM0_Dd;
    local_128.x = (float)ImGuiWindow::GetID(this,label,(char *)0x0);
    local_98 = CalcTextSize(label,(char *)0x0,true,-1.0);
    uVar19 = local_f8._8_8_;
    if ((local_f8._0_4_ == 0.0) && (!NAN(local_f8._0_4_))) {
      fVar9 = CalcItemWidth();
      auVar1._4_8_ = uVar19;
      auVar1._0_4_ = local_f8._4_4_;
      auVar18._0_8_ = auVar1._0_8_ << 0x20;
      auVar18._8_4_ = (undefined4)uStack_f0;
      auVar18._12_4_ = uStack_f0._4_4_;
      register0x000012c4 = auVar18._4_12_;
      local_f8._0_4_ = fVar9;
    }
    if ((local_f8._4_4_ == 0.0) && (!NAN(local_f8._4_4_))) {
      fVar9 = (pIVar6->Style).FramePadding.y;
      local_f8._4_4_ = fVar9 + fVar9 + local_98.y;
    }
    IVar11.x = (this->DC).CursorPos.x + local_f8._0_4_;
    fVar16 = local_f8._4_4_ + (this->DC).CursorPos.y;
    IVar11.y = fVar16;
    local_d8.Min = (this->DC).CursorPos;
    local_58._0_4_ = (pIVar6->Style).FramePadding.x;
    local_78._0_4_ = (pIVar6->Style).FramePadding.y;
    fVar9 = 0.0;
    if (0.0 < local_98.x) {
      fVar9 = (pIVar6->Style).ItemInnerSpacing.x + local_98.x;
    }
    fVar17 = local_d8.Min.x + (float)local_58._0_4_;
    local_a8 = ZEXT416((uint)(local_d8.Min.y + (float)local_78._0_4_));
    local_40.Max.y = fVar16 + 0.0;
    local_40.Max.x = fVar9 + IVar11.x;
    local_110 = pIVar6;
    local_d8.Max = IVar11;
    local_40.Min = local_d8.Min;
    ItemSize(&local_40,(pIVar6->Style).FramePadding.y);
    bVar2 = ItemAdd(&local_40,0,&local_d8);
    uVar7 = 0xffffffff;
    if (bVar2) {
      bVar2 = ItemHoverable(&local_d8,(ImGuiID)local_128.x);
      pIVar6 = local_110;
      local_88 = (float)CONCAT31(local_88._1_3_,bVar2);
      if (((local_b8 == 3.4028235e+38) && (!NAN(local_b8))) ||
         ((local_c8 == 3.4028235e+38 && (!NAN(local_c8))))) {
        if (values_count < 1) {
          local_128.x = -3.4028235e+38;
          fVar9 = 3.4028235e+38;
        }
        else {
          iVar5 = 0;
          local_128.x = -3.4028235e+38;
          local_128.y = 0.0;
          uStack_120._0_4_ = 0;
          uStack_120._4_4_ = 0;
          fVar9 = 3.4028235e+38;
          do {
            fVar4 = (*values_getter)(local_108,iVar5);
            if (!NAN(fVar4)) {
              if (fVar4 <= fVar9) {
                fVar9 = fVar4;
              }
              local_128.y = (float)((uint)local_128.y & extraout_var._0_4_);
              uStack_120._0_4_ = (uint)uStack_120 & extraout_var._4_4_;
              uStack_120._4_4_ = uStack_120._4_4_ & extraout_var._8_4_;
              local_128.x = (float)((uint)local_128.x & -(uint)(fVar4 <= local_128.x) |
                                   ~-(uint)(fVar4 <= local_128.x) & (uint)fVar4);
            }
            iVar5 = iVar5 + 1;
          } while (values_count != iVar5);
        }
        uStack_b4 = 0;
        uStack_b0 = 0;
        uStack_ac = 0;
        local_b8 = (float)(~-(uint)(local_b8 == 3.4028235e+38) & (uint)local_b8 |
                          (uint)fVar9 & -(uint)(local_b8 == 3.4028235e+38));
        local_c8 = (float)(~-(uint)(local_c8 == 3.4028235e+38) & (uint)local_c8 |
                          (uint)local_128.x & -(uint)(local_c8 == 3.4028235e+38));
      }
      IVar12 = local_d8.Max;
      local_128 = local_d8.Min;
      uStack_120 = 0;
      IVar3 = GetColorU32(7,1.0);
      RenderFrame(local_128,IVar12,IVar3,true,(pIVar6->Style).FrameRounding);
      uVar7 = 0xffffffff;
      fVar9 = (float)local_a8._0_4_;
      if ((int)((plot_type == ImGuiPlotType_Lines) + 1) <= values_count) {
        fVar9 = IVar11.x - (float)local_58._0_4_;
        fVar16 = fVar16 - (float)local_78._0_4_;
        iVar5 = (int)(float)local_f8._0_4_;
        if (values_count <= (int)(float)local_f8._0_4_) {
          iVar5 = values_count;
        }
        fVar4 = (float)(values_count - (uint)(plot_type == ImGuiPlotType_Lines));
        local_128.x = fVar4;
        uVar7 = 0xffffffff;
        if ((((local_88._0_1_ != '\0') && (fVar20 = (local_110->IO).MousePos.x, fVar17 <= fVar20))
            && (fVar10 = (local_110->IO).MousePos.y, (float)local_a8._0_4_ <= fVar10)) &&
           ((fVar20 < fVar9 && (fVar10 < fVar16)))) {
          fVar10 = (fVar20 - fVar17) / (fVar9 - fVar17);
          fVar20 = 0.9999;
          if (fVar10 <= 0.9999) {
            fVar20 = fVar10;
          }
          uVar7 = (uint)((float)(int)fVar4 * (float)(~-(uint)(fVar10 < 0.0) & (uint)fVar20));
          if (((int)uVar7 < 0) || (values_count <= (int)uVar7)) {
            __assert_fail("v_idx >= 0 && v_idx < values_count",
                          "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_widgets.cpp"
                          ,0x1880,
                          "int ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                         );
          }
          fVar4 = (*values_getter)(local_108,(int)(values_offset + uVar7) % values_count);
          local_f8._0_4_ = fVar4;
          (*values_getter)(local_108,(int)(values_offset + uVar7 + 1) % values_count);
          if (plot_type == ImGuiPlotType_Lines) {
            SetTooltip("%d: %8.4g\n%d: %8.4g",(ulong)uVar7,(ulong)(uVar7 + 1));
          }
          else if (plot_type == ImGuiPlotType_Histogram) {
            SetTooltip("%d: %8.4g",(double)(float)local_f8._0_4_,(ulong)uVar7);
          }
        }
        iVar5 = iVar5 - (uint)(plot_type == ImGuiPlotType_Lines);
        local_78 = ZEXT416(~-(uint)(local_b8 == local_c8) & (uint)(1.0 / (local_c8 - local_b8)));
        fVar4 = (*values_getter)(local_108,values_offset % values_count);
        if (0.0 <= local_c8 * local_b8) {
          local_88 = (float)(~-(uint)(local_b8 < 0.0) & 0x3f800000);
          uStack_84 = 0;
          uStack_80 = 0;
          uStack_7c = 0;
        }
        else {
          uStack_84 = uStack_b4 ^ 0x80000000;
          uStack_80 = uStack_b0 ^ 0x80000000;
          uStack_7c = uStack_ac ^ 0x80000000;
          local_88 = -local_b8 * (float)local_78._0_4_;
        }
        local_60 = label;
        local_fc = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x26,1.0);
        local_100 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x27,1.0);
        if (iVar5 < 1) {
          pIVar6 = local_110;
          label = local_60;
          fVar9 = (float)local_a8._0_4_;
        }
        else {
          fVar20 = (float)local_78._0_4_ * (fVar4 - local_b8);
          fVar4 = 1.0;
          if (fVar20 <= 1.0) {
            fVar4 = fVar20;
          }
          local_c8 = (float)(int)local_128.x;
          local_58._0_16_ = ZEXT416((uint)(1.0 / (float)iVar5));
          fVar16 = fVar16 - (float)local_a8._0_4_;
          local_88 = local_88 * fVar16 + (float)local_a8._0_4_;
          fVar10 = 0.0;
          fVar13 = 0.0;
          uVar14 = 0;
          uVar15 = 0;
          fVar4 = (float)(-(uint)(fVar20 < 0.0) & 0x3f800000 |
                         ~-(uint)(fVar20 < 0.0) & (uint)(1.0 - fVar4));
          do {
            uVar8 = (uint)(fVar10 * local_c8 + 0.5);
            if (((int)uVar8 < 0) || (values_count <= (int)uVar8)) {
              __assert_fail("v1_idx >= 0 && v1_idx < values_count",
                            "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_widgets.cpp"
                            ,0x189a,
                            "int ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                           );
            }
            local_128.y = (float)local_58._4_4_;
            local_128.x = (float)local_58._0_4_ + fVar10;
            uStack_120 = local_58._8_8_;
            local_f8._4_4_ = fVar13;
            local_f8._0_4_ = fVar10;
            uStack_f0._0_4_ = uVar14;
            uStack_f0._4_4_ = uVar15;
            fVar20 = (*values_getter)(local_108,(int)(values_offset + 1 + uVar8) % values_count);
            fVar10 = (fVar20 - local_b8) * (float)local_78._0_4_;
            fVar20 = 1.0;
            if (fVar10 <= 1.0) {
              fVar20 = fVar10;
            }
            fVar20 = (float)(-(uint)(fVar10 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar10 < 0.0) & (uint)(1.0 - fVar20));
            fVar10 = (float)local_f8._0_4_ * (fVar9 - fVar17) + fVar17;
            local_e0.y = fVar4 * fVar16 + (float)local_a8._0_4_;
            local_e0.x = fVar10;
            local_130.x = (fVar9 - fVar17) * local_128.x + fVar17;
            if (plot_type == ImGuiPlotType_Lines) {
              local_130.y = fVar16 * fVar20 + (float)local_a8._0_4_;
              IVar3 = local_fc;
              if (uVar7 == uVar8) {
                IVar3 = local_100;
              }
              ImDrawList::AddLine(this->DrawList,&local_e0,&local_130,IVar3,1.0);
            }
            else {
              local_130.y = local_88;
              if (plot_type == ImGuiPlotType_Histogram) {
                if (fVar10 + 2.0 <= local_130.x) {
                  local_130.x = local_130.x + -1.0;
                }
                IVar3 = local_fc;
                if (uVar7 == uVar8) {
                  IVar3 = local_100;
                }
                ImDrawList::AddRectFilled(this->DrawList,&local_e0,&local_130,IVar3,0.0,0xf);
              }
            }
            iVar5 = iVar5 + -1;
            fVar10 = local_128.x;
            fVar13 = local_128.y;
            uVar14 = (uint)uStack_120;
            uVar15 = uStack_120._4_4_;
            fVar4 = fVar20;
          } while (iVar5 != 0);
          pIVar6 = local_110;
          label = local_60;
          fVar9 = (float)local_a8._0_4_;
        }
      }
      fVar16 = local_98.x;
      if (overlay_text != (char *)0x0) {
        local_e0.y = local_d8.Min.y + (pIVar6->Style).FramePadding.y;
        local_e0.x = local_d8.Min.x;
        local_130.x = 0.5;
        local_130.y = 0.0;
        RenderTextClipped(&local_e0,&local_d8.Max,overlay_text,(char *)0x0,(ImVec2 *)0x0,&local_130,
                          (ImRect *)0x0);
        fVar16 = local_98.x;
        fVar9 = (float)local_a8._0_4_;
      }
      if (0.0 < fVar16) {
        IVar12.x = local_d8.Max.x + (pIVar6->Style).ItemInnerSpacing.x;
        IVar12.y = fVar9;
        RenderText(IVar12,label,(char *)0x0,true);
      }
    }
  }
  return uVar7;
}

Assistant:

int ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 frame_size)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return -1;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (frame_size.x == 0.0f)
        frame_size.x = CalcItemWidth();
    if (frame_size.y == 0.0f)
        frame_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return -1;
    const bool hovered = ItemHoverable(frame_bb, id);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            if (v != v) // Ignore NaN values
                continue;
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    const int values_count_min = (plot_type == ImGuiPlotType_Lines) ? 2 : 1;
    int idx_hovered = -1;
    if (values_count >= values_count_min)
    {
        int res_w = ImMin((int)frame_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        if (hovered && inner_bb.Contains(g.IO.MousePos))
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx + 1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            idx_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (-scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f, 0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);

    // Return hovered index or -1 if none are hovered.
    // This is currently not exposed in the public API because we need a larger redesign of the whole thing, but in the short-term we are making it available in PlotEx().
    return idx_hovered;
}